

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall
efsw::DirWatcherGeneric::DirWatcherGeneric
          (DirWatcherGeneric *this,DirWatcherGeneric *parent,WatcherGeneric *ws,string *directory,
          bool recursive,bool reportNewFiles)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _List_node_base *p_Var3;
  DirectorySnapshotDiff *this_00;
  allocator<char> local_209;
  DirectorySnapshot *local_208;
  string local_200;
  string local_1e0;
  DirectorySnapshotDiff Diff;
  DirectorySnapshotDiff local_f8;
  
  this->Parent = parent;
  this->Watch = ws;
  local_208 = &this->DirSnap;
  DirectorySnapshot::DirectorySnapshot(local_208);
  p_Var1 = &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Recursive = recursive;
  this->Deleted = false;
  std::__cxx11::string::string((string *)&local_200,(string *)directory);
  resetDirectory(this,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (reportNewFiles) {
    DirectorySnapshot::scan(&Diff,local_208);
    bVar2 = DirectorySnapshotDiff::changed(&Diff);
    if (bVar2) {
      p_Var3 = (_List_node_base *)&Diff.FilesCreated;
      while (p_Var3 = (((_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                       &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var3 != (_List_node_base *)&Diff.FilesCreated) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",&local_209);
        handleAction(this,(string *)(p_Var3 + 1),1,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
    }
    this_00 = &Diff;
  }
  else {
    DirectorySnapshot::scan(&local_f8,local_208);
    this_00 = &local_f8;
  }
  DirectorySnapshotDiff::~DirectorySnapshotDiff(this_00);
  return;
}

Assistant:

DirWatcherGeneric::DirWatcherGeneric( DirWatcherGeneric * parent, WatcherGeneric * ws, const std::string& directory, bool recursive, bool reportNewFiles ) :
	Parent( parent ),
	Watch( ws ),
	Recursive( recursive ),
	Deleted( false )
{
	resetDirectory( directory );

	if ( !reportNewFiles )
	{
		DirSnap.scan();
	}
	else
	{
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( Diff.changed() )
		{
			FileInfoList::iterator it;

			DiffIterator( FilesCreated )
			{
				handleAction( ( *it ).Filepath, Actions::Add );
			}
		}
	}
}